

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.h
# Opt level: O0

void __thiscall bloaty::RollupRow::~RollupRow(RollupRow *this)

{
  string *in_RDI;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *unaff_retaddr;
  
  std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::~vector(unaff_retaddr);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

RollupRow(const std::string& name_) : name(name_) {}